

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O1

void __thiscall
llbuild::basic::StringList::StringList<llvm::StringRef>
          (StringList *this,ArrayRef<llvm::StringRef> values)

{
  size_t __n;
  long lVar1;
  char *__dest;
  void *pvVar2;
  uint64_t uVar3;
  size_type sVar4;
  StringRef *pSVar5;
  StringRef *pSVar6;
  char *pcVar7;
  
  sVar4 = values.Length;
  pSVar5 = values.Data;
  this->contents = (char *)0x0;
  this->size = 0;
  if (sVar4 != 0) {
    lVar1 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + *(long *)((long)&pSVar5->Length + lVar1) + 1;
      this->size = uVar3;
      lVar1 = lVar1 + 0x10;
    } while (sVar4 * 0x10 != lVar1);
  }
  __dest = (char *)operator_new__(this->size + 1);
  this->contents = __dest;
  if (sVar4 != 0) {
    pSVar6 = pSVar5 + sVar4;
    do {
      pcVar7 = pSVar5->Data;
      __n = pSVar5->Length;
      if (__n == 0) {
LAB_00140dc0:
        lVar1 = -1;
      }
      else {
        pvVar2 = memchr(pcVar7,0,__n);
        if (pvVar2 == (void *)0x0) goto LAB_00140dc0;
        lVar1 = (long)pvVar2 - (long)pcVar7;
      }
      if (lVar1 != -1) {
        __assert_fail("value.find(\'\\0\') == StringRef::npos",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                      ,0x40,
                      "llbuild::basic::StringList::StringList(const ArrayRef<StringType>) [StringType = llvm::StringRef]"
                     );
      }
      memcpy(__dest,pcVar7,__n);
      pcVar7 = __dest + __n;
      __dest = pcVar7 + 1;
      *pcVar7 = '\0';
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar6);
  }
  *__dest = '\0';
  return;
}

Assistant:

explicit StringList(const ArrayRef<StringType> values) {
    // Construct the concatenated data.
    for (auto value: values) {
      size += value.size() + 1;
    }
    // Make sure to allocate at least 1 byte.
    char* p = nullptr;
    contents = p = new char[size + 1];
    for (auto value: values) {
      assert(value.find('\0') == StringRef::npos);
      memcpy(p, value.data(), value.size());
      p += value.size();
      *p++ = '\0';
    }
    *p = '\0';
  }